

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void down_box_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  Fl_Widget *pFVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar6;
  long lVar7;
  void **ppvVar8;
  Fl_Widget_Type *q;
  Fl_Widget_Type *this;
  Fl_Widget_Type **ppFVar9;
  void *pvVar10;
  char cVar11;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x18])();
    if ((iVar4 == 0) ||
       (iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar4 != 0)) {
      iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
      iVar4 = strcmp((char *)CONCAT44(extraout_var,iVar4),"Fl_Input_Choice");
      if (iVar4 == 0) {
        ppFVar9 = (Fl_Widget_Type **)&current_widget->o;
        lVar5 = 0x89;
        lVar7 = 0xa8;
      }
      else {
        iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1f])();
        if (iVar4 == 0) {
          Fl_Widget::deactivate((Fl_Widget *)i);
          return;
        }
        lVar5 = 0x89;
        lVar7 = 0xd0;
        ppFVar9 = &current_widget;
      }
    }
    else {
      ppFVar9 = &current_widget;
      lVar5 = 0x7e;
      lVar7 = 0xd0;
    }
    pvVar10 = (void *)(ulong)*(byte *)(*(long *)((long)&((Fl_Widget *)*ppFVar9)->_vptr_Fl_Widget +
                                                lVar7) + lVar5);
    Fl_Widget::activate((Fl_Widget *)i);
    pvVar6 = (void *)0x3e8;
    if (pvVar10 != (void *)0x0) {
      pvVar6 = pvVar10;
    }
    ppvVar8 = &boxmenu[0].user_data_;
    lVar5 = 0;
    do {
      if (pvVar6 == *ppvVar8) {
        Fl_Choice::value(i,(int)lVar5);
        return;
      }
      lVar5 = lVar5 + 1;
      ppvVar8 = ppvVar8 + 7;
    } while (lVar5 != 0x3d);
  }
  else {
    pFVar1 = (i->super_Fl_Menu_).value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      lVar5 = -1;
    }
    else {
      lVar5 = (long)((int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) *
                    -0x49249249);
    }
    iVar4 = (int)boxmenu[lVar5].user_data_;
    if ((iVar4 != 0) && (Fl_Type::first != (Fl_Type *)0x0)) {
      bVar3 = false;
      cVar11 = (char)boxmenu[lVar5].user_data_;
      this = (Fl_Widget_Type *)Fl_Type::first;
      if (iVar4 == 1000) {
        cVar11 = '\0';
      }
      do {
        if ((this->super_Fl_Type).selected != '\0') {
          iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
          if ((iVar4 == 0) ||
             (iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this), iVar4 != 0)) {
            iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])(this);
            iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"Fl_Input_Choice");
            if (iVar4 == 0) {
              this->o[1].label_.value[0x89] = cVar11;
              bVar3 = true;
            }
            else {
              iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1f])(this);
              bVar3 = true;
              if (iVar4 != 0) {
                *(char *)((long)&this->o[1].callback_ + 1) = cVar11;
              }
            }
          }
          else {
            pFVar2 = this->o;
            *(char *)((long)&pFVar2[1]._vptr_Fl_Widget + 6) = cVar11;
            bVar3 = true;
            if (*(char *)((long)&pFVar2[1]._vptr_Fl_Widget + 4) != '\0') {
              Fl_Widget_Type::redraw(this);
            }
          }
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
      } while (this != (Fl_Widget_Type *)0x0);
      if (bVar3) {
        set_modflag(1);
        return;
      }
    }
  }
  return;
}

Assistant:

void down_box_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n;
    if (current_widget->is_button() && !current_widget->is_menu_item())
      n = ((Fl_Button*)(current_widget->o))->down_box();
    else if (!strcmp(current_widget->type_name(), "Fl_Input_Choice"))
      n = ((Fl_Input_Choice*)(current_widget->o))->down_box();
    else if (current_widget->is_menu_button())
      n = ((Fl_Menu_*)(current_widget->o))->down_box();
    else {
      i->deactivate(); return;
    }
    i->activate();
    if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(boxmenu)/sizeof(*boxmenu)); j++)
      if (boxmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(boxmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected) {
	if (o->is_button() && !o->is_menu_item()) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
          ((Fl_Button*)(q->o))->down_box((Fl_Boxtype)n);
          if (((Fl_Button*)(q->o))->value()) q->redraw();
	} else if (!strcmp(o->type_name(), "Fl_Input_Choice")) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	  ((Fl_Input_Choice*)(q->o))->down_box((Fl_Boxtype)n);
	} else if (o->is_menu_button()) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
          ((Fl_Menu_*)(q->o))->down_box((Fl_Boxtype)n);
	}
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}